

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_base.cpp
# Opt level: O0

uint64_t r_exec::ModelBase::MEntry::_ComputeHashCode(_Fact *component)

{
  bool bVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  ulong uVar6;
  undefined4 local_24;
  uint16_t opcode;
  Atom head;
  long *plStack_20;
  Code *payload;
  uint64_t hash_code;
  _Fact *component_local;
  
  bVar1 = _Fact::is_fact(component);
  if (bVar1) {
    payload = (Code *)0x0;
  }
  else {
    payload = (Code *)0x2000;
  }
  iVar4 = (*(component->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])();
  plStack_20 = (long *)CONCAT44(extraout_var,iVar4);
  puVar5 = (undefined4 *)(**(code **)(*plStack_20 + 0x20))(plStack_20,0);
  local_24 = *puVar5;
  uVar3 = r_code::Atom::asOpcode();
  cVar2 = r_code::Atom::getDescriptor();
  if (cVar2 == -0x3d) {
    if (uVar3 == Opcodes::Cmd) {
      payload = (Code *)((ulong)payload | 0x800);
      (**(code **)(*plStack_20 + 0x20))(plStack_20,1);
      uVar3 = r_code::Atom::asOpcode();
      payload = (Code *)((long)(int)(uVar3 & 0x3ff) | (ulong)payload);
    }
    else if (uVar3 == Opcodes::IMdl) {
      payload = (Code *)((ulong)payload | 0xc00);
      uVar6 = (**(code **)(*plStack_20 + 0x48))(plStack_20,0);
      payload = (Code *)(uVar6 & 0x3ff | (ulong)payload);
    }
    else if (uVar3 == Opcodes::ICst) {
      payload = (Code *)((ulong)payload | 0x1000);
      uVar6 = (**(code **)(*plStack_20 + 0x48))(plStack_20,0);
      payload = (Code *)(uVar6 & 0x3ff | (ulong)payload);
    }
    else {
      payload = (Code *)((long)(int)(uVar3 & 0x3ff) | (ulong)payload);
    }
  }
  else if (cVar2 == -0x3c) {
    payload = (Code *)((long)(int)(uVar3 & 0x3ff) | (ulong)payload | 0x400);
  }
  r_code::Atom::~Atom((Atom *)&local_24);
  return (uint64_t)payload;
}

Assistant:

uint64_t ModelBase::MEntry::_ComputeHashCode(_Fact *component)   // 14 bits: [fact or |fact (1)|type (3)|data (10)].
{
    uint64_t hash_code;

    if (component->is_fact()) {
        hash_code = 0x00000000;
    } else {
        hash_code = 0x00002000;
    }

    Code *payload = component->get_reference(0);
    Atom head = payload->code(0);
    uint16_t opcode = head.asOpcode();

    switch (head.getDescriptor()) {
    case Atom::OBJECT:
        if (opcode == Opcodes::Cmd) { // type: 2.
            hash_code |= 0x00000800;
            hash_code |= (payload->code(CMD_FUNCTION).asOpcode() & 0x000003FF); // data: function id.
        } else if (opcode == Opcodes::IMdl) { // type 3.
            hash_code |= 0x00000C00;
            hash_code |= (((uintptr_t)payload->get_reference(0)) & 0x000003FF); // data: address of the mdl.
        } else if (opcode == Opcodes::ICst) { // type 4.
            hash_code |= 0x00001000;
            hash_code |= (((uintptr_t)payload->get_reference(0)) & 0x000003FF); // data: address of the cst.
        } else { // type: 0.
            hash_code |= (opcode & 0x000003FF);    // data: class id.
        }

        break;

    case Atom::MARKER: // type 1.
        hash_code |= 0x00000400;
        hash_code |= (opcode & 0x000003FF); // data: class id.
        break;
    }

    return hash_code;
}